

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  char cVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 lowestValid;
  size_t sVar6;
  ulong uVar7;
  seqDef *psVar8;
  uint uVar9;
  long lVar10;
  BYTE *litEnd;
  ulong uVar11;
  int *ip;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  U32 UVar16;
  ulong uVar17;
  BYTE *pBVar18;
  int *ip_00;
  size_t offbaseFound;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  BYTE *local_90;
  int *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  BYTE *litLimit_w;
  int *local_68;
  uint local_5c;
  int *local_58;
  long local_50;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  local_90 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  local_38 = local_90 + uVar9;
  local_94 = (ms->cParams).minMatch;
  if (5 < local_94) {
    local_94 = 6;
  }
  if (local_94 < 5) {
    local_94 = 4;
  }
  local_5c = (ms->cParams).searchLog;
  local_98 = 6;
  if (local_5c < 6) {
    local_98 = local_5c;
  }
  if (local_98 < 5) {
    local_98 = 4;
  }
  ip_00 = (int *)((ulong)((int)src == (int)local_38) + (long)src);
  iVar15 = (int)ip_00 - (int)local_90;
  uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_78 = *rep;
  local_74 = iVar15 - uVar12;
  if (iVar15 - uVar9 <= uVar12) {
    local_74 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    local_74 = uVar9;
  }
  local_7c = rep[1];
  ms->lazySkipping = 0;
  local_74 = iVar15 - local_74;
  local_68 = (int *)((long)src + (srcSize - 0x10));
  uVar9 = ms->nextToUpdate;
  uVar11 = (ulong)uVar9;
  uVar12 = ((int)local_68 - (int)(local_90 + uVar11)) + 1;
  if (7 < uVar12) {
    uVar12 = 8;
  }
  uVar14 = 0;
  if (local_90 + uVar11 <= local_68) {
    uVar14 = uVar12;
  }
  cVar3 = (char)ms->rowHashLog;
  pInLimit = (BYTE *)((long)src + srcSize);
  for (; uVar11 < uVar14 + uVar9; uVar11 = uVar11 + 1) {
    if (local_94 == 5) {
      uVar17 = *(long *)(local_90 + uVar11) * -0x30e4432345000000;
LAB_00f43373:
      UVar16 = (U32)((uVar17 ^ ms->hashSalt) >> (0x38U - cVar3 & 0x3f));
    }
    else {
      if (local_94 == 6) {
        uVar17 = *(long *)(local_90 + uVar11) * -0x30e4432340650000;
        goto LAB_00f43373;
      }
      UVar16 = (*(int *)(local_90 + uVar11) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar3 & 0x1f);
    }
    ms->hashCache[(uint)uVar11 & 7] = UVar16;
  }
  uVar9 = local_7c;
  if (local_74 < local_7c) {
    uVar9 = 0;
  }
  local_a0 = local_78;
  if (local_74 < local_78) {
    local_a0 = 0;
  }
  litLimit_w = pInLimit + -0x20;
  local_48 = seqStore;
  local_40 = rep;
  uVar12 = local_94;
  do {
    local_9c = uVar9;
    local_50 = -(ulong)local_a0;
    while( true ) {
      uVar9 = local_98;
      if (local_68 <= ip_00) {
        if (local_7c <= local_74) {
          local_7c = 0;
        }
        uVar9 = local_7c;
        if (local_a0 != 0) {
          uVar9 = local_78;
        }
        if (local_78 <= local_74) {
          uVar9 = local_7c;
          local_78 = 0;
        }
        if (local_a0 != 0) {
          local_78 = local_a0;
        }
        if (local_9c != 0) {
          uVar9 = local_9c;
        }
        *local_40 = local_78;
        local_40[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if (local_a0 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        if (*(int *)((long)ip_00 + local_50 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar6 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + local_50 + 5),pInLimit
                            );
          uVar11 = sVar6 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar12 == 6) {
        if (uVar9 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
        else if (uVar9 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
      }
      else if (uVar12 == 5) {
        if (uVar9 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
        else if (uVar9 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
        }
      }
      else if (uVar9 == 6) {
        uVar17 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
      }
      else if (uVar9 == 5) {
        uVar17 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
      }
      else {
        uVar17 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)ip_00,pInLimit,&offbaseFound);
      }
      uVar7 = uVar11;
      if (uVar11 < uVar17) {
        uVar7 = uVar17;
      }
      if (3 < uVar7) break;
      uVar11 = (long)ip_00 - (long)src;
      ip_00 = (int *)((long)ip_00 + (uVar11 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar11);
    }
    local_88 = (int *)((long)ip_00 + 1);
    uVar13 = 1;
    if (uVar11 < uVar17) {
      local_88 = ip_00;
      uVar13 = offbaseFound;
    }
    for (pBVar18 = (BYTE *)((long)ip_00 + 5); uVar11 = uVar7, pBVar18 + -5 < local_68;
        pBVar18 = pBVar18 + 1) {
      ip = (int *)(pBVar18 + -4);
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else if ((local_a0 != 0) && (*(int *)(pBVar18 + -4) == *(int *)(pBVar18 + local_50 + -4))) {
        local_58 = ip;
        sVar6 = ZSTD_count(pBVar18,pBVar18 + local_50,pInLimit);
        ip = local_58;
        uVar12 = local_94;
        if (sVar6 < 0xfffffffffffffffc) {
          uVar9 = 0x1f;
          if ((uint)uVar13 != 0) {
            for (; (uint)uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar7 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
            local_88 = local_58;
            uVar13 = 1;
            uVar11 = sVar6 + 4;
          }
        }
      }
      offbaseFound = 999999999;
      if (uVar12 == 6) {
        if (local_98 == 6) {
          uVar7 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else if (local_98 == 5) {
          uVar7 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else {
          uVar7 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
      }
      else if (uVar12 == 5) {
        if (local_98 == 6) {
          uVar7 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else if (local_98 == 5) {
          uVar7 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else {
          uVar7 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
      }
      else if (local_98 == 6) {
        uVar7 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      else if (local_98 == 5) {
        uVar7 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      else {
        uVar7 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      uVar12 = local_94;
      if (uVar7 < 4) break;
      uVar9 = 0x1f;
      if ((uint)uVar13 != 0) {
        for (; (uint)uVar13 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      iVar15 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar15 == 0; iVar15 = iVar15 + -1) {
        }
      }
      if ((int)uVar7 * 4 - iVar15 <= (int)((uVar9 ^ 0x1f) + (int)uVar11 * 4 + -0x1b)) break;
      ip_00 = (int *)((long)ip_00 + 1);
      uVar13 = offbaseFound;
      local_88 = ip_00;
    }
    psVar5 = local_48;
    if (3 < uVar13) {
      for (; ((src < local_88 && (local_38 < (BYTE *)((long)local_88 + (3 - uVar13)))) &&
             (*(char *)((long)local_88 + -1) == *(char *)((long)local_88 + (2 - uVar13))));
          local_88 = (int *)((long)local_88 + -1)) {
        uVar11 = uVar11 + 1;
      }
      local_9c = local_a0;
      local_a0 = (U32)uVar13 - 3;
    }
    uVar17 = (long)local_88 - (long)src;
    pBVar18 = local_48->lit;
    if (litLimit_w < local_88) {
      ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)local_88,litLimit_w);
LAB_00f437fa:
      psVar5->lit = psVar5->lit + uVar17;
      psVar8 = psVar5->sequences;
      if (0xffff < uVar17) {
        psVar5->longLengthType = ZSTD_llt_literalLength;
        psVar5->longLengthPos = (U32)((ulong)((long)psVar8 - (long)psVar5->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar18 = *src;
      *(undefined8 *)(pBVar18 + 8) = uVar4;
      pBVar18 = local_48->lit;
      if (0x10 < uVar17) {
        uVar4 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar18 + 0x18) = uVar4;
        if (0x20 < (long)uVar17) {
          lVar10 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x20);
            uVar4 = puVar2[1];
            pBVar1 = pBVar18 + lVar10 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar4;
            puVar2 = (undefined8 *)((long)src + lVar10 + 0x30);
            uVar4 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar4;
            lVar10 = lVar10 + 0x20;
          } while (pBVar1 + 0x20 < pBVar18 + uVar17);
        }
        goto LAB_00f437fa;
      }
      local_48->lit = pBVar18 + uVar17;
      psVar8 = local_48->sequences;
    }
    psVar8->litLength = (U16)uVar17;
    psVar8->offBase = (U32)uVar13;
    if (0xffff < uVar11 - 3) {
      psVar5->longLengthType = ZSTD_llt_matchLength;
      psVar5->longLengthPos = (U32)((ulong)((long)psVar8 - (long)psVar5->sequencesStart) >> 3);
    }
    psVar8->mlBase = (U16)(uVar11 - 3);
    psVar5->sequences = psVar8 + 1;
    if (ms->lazySkipping != 0) {
      uVar9 = ms->nextToUpdate;
      uVar17 = (ulong)uVar9;
      uVar14 = ((int)local_68 - (int)(local_90 + uVar17)) + 1;
      if (7 < uVar14) {
        uVar14 = 8;
      }
      if (local_68 < local_90 + uVar17) {
        uVar14 = 0;
      }
      cVar3 = (char)ms->rowHashLog;
      for (; uVar17 < uVar14 + uVar9; uVar17 = uVar17 + 1) {
        if (uVar12 == 5) {
          uVar7 = *(long *)(local_90 + uVar17) * -0x30e4432345000000;
LAB_00f43961:
          UVar16 = (U32)((uVar7 ^ ms->hashSalt) >> (0x38U - cVar3 & 0x3f));
        }
        else {
          if (uVar12 == 6) {
            uVar7 = *(long *)(local_90 + uVar17) * -0x30e4432340650000;
            goto LAB_00f43961;
          }
          UVar16 = (*(int *)(local_90 + uVar17) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar3 & 0x1f);
        }
        ms->hashCache[(uint)uVar17 & 7] = UVar16;
      }
      ms->lazySkipping = 0;
    }
    uVar14 = local_9c;
    for (src = (void *)((long)local_88 + uVar11);
        ((uVar9 = uVar14, ip_00 = (int *)src, uVar9 != 0 && (src <= local_68)) &&
        (*src == *(int *)((long)src - (ulong)uVar9))); src = (void *)((long)src + sVar6 + 4)) {
      sVar6 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)uVar9)),pInLimit);
      pBVar18 = psVar5->lit;
      if (litLimit_w < src) {
        ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)src,litLimit_w);
      }
      else {
        uVar4 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar18 = *src;
        *(undefined8 *)(pBVar18 + 8) = uVar4;
      }
      psVar8 = psVar5->sequences;
      psVar8->litLength = 0;
      psVar8->offBase = 1;
      if (0xffff < sVar6 + 1) {
        psVar5->longLengthType = ZSTD_llt_matchLength;
        psVar5->longLengthPos = (U32)((ulong)((long)psVar8 - (long)psVar5->sequencesStart) >> 3);
      }
      psVar8->mlBase = (U16)(sVar6 + 1);
      psVar5->sequences = psVar8 + 1;
      uVar14 = local_a0;
      local_a0 = uVar9;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}